

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

void mp_next_slowpath(char **data,int64_t k)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  
  if (0 < k) {
    puVar8 = (ulong *)*data;
    do {
      uVar7 = *puVar8;
      puVar6 = (ulong *)((long)puVar8 + 1);
      *data = (char *)puVar6;
      cVar1 = ""[(byte)uVar7];
      lVar9 = (long)cVar1;
      if (-1 < lVar9) {
        if (((k & 0x3fU) != 0) || (cVar1 != '\0')) {
          puVar6 = (ulong *)((long)puVar6 + lVar9);
          goto LAB_00134a02;
        }
        for (; 8 < k; k = k - 8) {
          uVar4 = *puVar6;
          *data = (char *)(puVar6 + 1);
          if ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38) !=
              (ulong)(byte)uVar7 * 0x101010101010101) {
            *data = (char *)puVar6;
            break;
          }
          puVar6 = puVar6 + 1;
        }
        goto LAB_00134a05;
      }
      if (-0x20 < cVar1) {
        k = k - lVar9;
        goto LAB_00134a05;
      }
      switch(cVar1) {
      case -0x29:
        uVar3 = *(uint *)((long)puVar8 + 1);
        puVar6 = (ulong *)((long)puVar8 +
                          (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18) + 6);
        break;
      case -0x28:
        puVar6 = (ulong *)((long)puVar8 +
                          (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                         *(ushort *)((long)puVar8 + 1) >> 8) + 4);
        break;
      case -0x27:
        uVar7 = (ulong)*(byte *)((long)puVar8 + 1);
        goto LAB_00134b37;
      case -0x26:
        uVar3 = *(uint *)((long)puVar8 + 1);
        uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        puVar6 = (ulong *)((long)puVar8 + 5);
        *data = (char *)puVar6;
        goto LAB_00134ae0;
      case -0x25:
        uVar2 = *(ushort *)((long)puVar8 + 1);
        puVar6 = (ulong *)((long)puVar8 + 3);
        *data = (char *)puVar6;
        uVar7 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
LAB_00134ae0:
        uVar7 = uVar7 * 2;
        goto LAB_00134b0e;
      case -0x24:
        uVar3 = *(uint *)((long)puVar8 + 1);
        uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        puVar6 = (ulong *)((long)puVar8 + 5);
        *data = (char *)puVar6;
        goto LAB_00134b0e;
      case -0x23:
        uVar2 = *(ushort *)((long)puVar8 + 1);
        puVar6 = (ulong *)((long)puVar8 + 3);
        *data = (char *)puVar6;
        uVar7 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
LAB_00134b0e:
        k = k + uVar7;
        goto LAB_00134a05;
      case -0x22:
        uVar3 = *(uint *)((long)puVar8 + 1);
        puVar6 = (ulong *)((long)puVar8 +
                          (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18) + 5);
        break;
      case -0x21:
        uVar7 = (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                               *(ushort *)((long)puVar8 + 1) >> 8);
LAB_00134b37:
        puVar6 = (ulong *)((long)puVar8 + uVar7 + 3);
        break;
      case -0x20:
        puVar6 = (ulong *)((long)puVar8 + (ulong)*(byte *)((long)puVar8 + 1) + 2);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0xc87,"void mp_next_slowpath(const char **, int64_t)");
      }
LAB_00134a02:
      *data = (char *)puVar6;
LAB_00134a05:
      bVar5 = 1 < k;
      k = k - 1;
      puVar8 = puVar6;
    } while (bVar5);
  }
  return;
}

Assistant:

MP_IMPL void
mp_next_slowpath(const char **data, int64_t k)
{
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			/*
			 *  Same one-byte-encoded-value optimisation.
			 *  Good for skipping tons of NILs, zeros etc.
			 *  Run not more than once per 64 cycles (or about)
			 * in order to avoid degradation for other cases.
			 *  Note that l == 0 means that the last byte (that is
			 * in variable `c`) is one-byte-encoded-value.
			 *  The idea of optimization is to read the next 8 bytes
			 * as one 8byte uint and check if all bytes of that
			 * word are the same value (`c`). If so - skip 8 bytes
			 * at once and repeat.
			 *  A small trick is used to create an 8byte uint that
			 * consists of 8 bytes that equal to one byte (`c`):
			 * by rules of multiplication if multiply an one-byte
			 * value (for example 0xab) by 0x0101010101010101 we
			 * will get 0xabababababababab. That works for any byte.
			 */
			if (mp_unlikely(l == 0 && k % 64 == 0)) {
				/*
				 * Check k > 8 that there are at least 8 values
				 * more expected, that are at least 8 bytes of
				 * total length, that allows us to read 8 bytes.
				 */
				while (k > 8) {
					const char *save = *data;
					uint64_t u = mp_load_u64(data);
					/*
					 * Check that `u` is 8 `c` bytes,
					 * see the trick explanation above.
					 */
					if (u != c * 0x0101010101010101ull) {
						/* Wrong, restore pointer. */
						*data = save;
						break;
					}
					/* Confirm reading of 8 values. */
					k -= 8;
				}
				continue;
			}
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			len = mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			len = mp_load_u16(data);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			len = mp_load_u32(data);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			len = mp_load_u8(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			len = mp_load_u16(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			len = mp_load_u32(data);
			mp_load_u8(data);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}
}